

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O0

int32_t MsgHelper::resolvAddr(S5AddrInfo *info,uint8_t *data)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  char *pcVar4;
  byte local_2a;
  int local_28;
  uint8_t i;
  uint8_t addrLen;
  uint32_t ADDR_LEN;
  uint8_t ATYP;
  uint8_t *data_local;
  S5AddrInfo *info_local;
  
  uVar1 = *data;
  memset(info->ADDR,0,0x100);
  if (uVar1 == '\x01') {
    local_28 = 4;
    pcVar4 = inet_ntop(2,data + 1,info->ADDR,0x100);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  else if (uVar1 == '\x03') {
    bVar2 = data[1];
    for (local_2a = 0; local_2a < bVar2; local_2a = local_2a + 1) {
      info->ADDR[local_2a] = data[(int)(local_2a + 2)];
    }
    local_28 = bVar2 + 1;
  }
  else {
    if (uVar1 != '\x04') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                    ,0x196,"static int32_t MsgHelper::resolvAddr(S5AddrInfo *, uint8_t *)");
    }
    local_28 = 0x10;
    pcVar4 = inet_ntop(10,data + 1,info->ADDR,0x100);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  info->ATYP = uVar1;
  uVar3 = htons(*(uint16_t *)(data + (local_28 + 1)));
  info->PORT = uVar3;
  return local_28 + 3;
}

Assistant:

int32_t MsgHelper::resolvAddr(S5AddrInfo* info, uint8_t* data)
{
	uint8_t ATYP = data[0];
	uint32_t ADDR_LEN = 0;

	memset(info->ADDR, 0, sizeof(info->ADDR));
	// ipv4
	if (ATYP == SOKS5_ATYP_IPV4)
	{
		ADDR_LEN = 4;
		if(NULL == ::inet_ntop(AF_INET, data + 1, info->ADDR, sizeof(info->ADDR)))
			return 0;
	}
	// domain name
	else if (ATYP == SOKS5_ATYP_DOMAIN)
	{
		uint8_t addrLen = (uint8_t)data[1];
		for (uint8_t i = 0; i < addrLen; ++i)
		{
			info->ADDR[i] = data[2 + i];
		}

		ADDR_LEN = addrLen;
		ADDR_LEN ++;
	}
	// ipv6
	else if (ATYP == SOKS5_ATYP_IPV6)
	{
		ADDR_LEN = 16;
		if(NULL == ::inet_ntop(AF_INET6, data + 1, info->ADDR, sizeof(info->ADDR)))
			return 0;
	}
	else
	{
		assert(0);
		return 0;
	}
	info->ATYP = ATYP;
	info->PORT = ::htons(*((uint16_t*)&data[ADDR_LEN + 1]));

	return ADDR_LEN + 1 + 2;
}